

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.c
# Opt level: O2

ufile_error bucket_request_do(CURL *curl,char *url,bucket_resp *br)

{
  uint uVar1;
  int iVar2;
  cJSON *item;
  char *pcVar3;
  ulong uVar4;
  cJSON *pcVar5;
  ufile_error uVar6;
  http_body response_body;
  char tmp [2048];
  
  curl_easy_setopt(curl,0x2712,url);
  curl_easy_setopt(curl,0x2734,"GET");
  if (_g_debug_open != 0) {
    curl_easy_setopt(curl,0x29,1);
  }
  curl_easy_setopt(curl,99,1);
  response_body.buffer_size = 0;
  response_body.pos_n = 0;
  response_body.f = (FILE *)0x0;
  response_body.buffer = (char *)0x0;
  memset(tmp,0,0x800);
  response_body.buffer_size = 0x800;
  response_body.buffer = tmp;
  curl_easy_setopt(curl,0x4e2b,http_write_cb);
  curl_easy_setopt(curl,0x2711,&response_body);
  curl_do(curl);
  item = cJSON_Parse(response_body.buffer);
  if (item == (cJSON *)0x0) {
    uVar4 = 0xfffffffffffffff6;
    pcVar3 = cJSON_GetErrorPtr();
  }
  else {
    pcVar5 = (cJSON *)&item->child;
    while (pcVar5 = pcVar5->next, pcVar5 != (cJSON *)0x0) {
      pcVar3 = pcVar5->string;
      iVar2 = strcmp(pcVar3,"RetCode");
      if (iVar2 == 0) {
        br->code = pcVar5->valueint;
      }
      else {
        iVar2 = strcmp(pcVar3,"Message");
        if (iVar2 == 0) {
          pcVar3 = ufile_strconcat(pcVar5->valuestring,0);
          br->msg = pcVar3;
        }
      }
    }
    if ((_g_debug_open != 0) && (br->code != 0)) {
      printf("RetCode=%d;\nmessage=%s\n",(ulong)(uint)br->code,br->msg);
    }
    cJSON_Delete(item);
    uVar1 = br->code;
    uVar4 = (ulong)uVar1;
    if (uVar1 == 0) {
      pcVar3 = "";
      uVar4 = 0;
    }
    else if (uVar1 - 0x3a9d < 3) {
      pcVar3 = "Operation failed, please try again later.";
    }
    else if (uVar1 == 0x96) {
      pcVar3 = anon_var_dwarf_a88;
    }
    else if (uVar1 == 0x3acc) {
      pcVar3 = "The Token is unbound, it cannot delete.";
    }
    else if (uVar1 == 0xab) {
      pcVar3 = "Invalid signature.";
    }
    else if (uVar1 == 0xac) {
      pcVar3 = "The account does not exist.";
    }
    else if (uVar1 == 0xad) {
      pcVar3 = "The account has been restricted.";
    }
    else if (uVar1 == 15000) {
      pcVar3 = "Duplicate bucket name, please input again.";
    }
    else if (uVar1 == 0x3a99) {
      pcVar3 = "Illegal bucket name.";
    }
    else if (uVar1 == 0x3a9c) {
      pcVar3 = "This operation request has timed out, please retry later.";
    }
    else if (uVar1 == 0x3aaf) {
      pcVar3 = "The bucket does not empty, it can\'t delete.";
    }
    else if (uVar1 == 0x3ab6) {
      pcVar3 = "Your CDN quota is full.";
    }
    else if (uVar1 == 0x3abd) {
      pcVar3 = "No permission.";
    }
    else if (uVar1 == 0x3ac1) {
      pcVar3 = "User has not certified.";
    }
    else if (uVar1 == 0x3acb) {
      pcVar3 = "Bucket creation failure, quota is insufficient.";
    }
    else if (uVar1 == 0x98) {
      pcVar3 = "API error or Service unavailable";
    }
    else {
      pcVar3 = "Internal error, please submit a ticket or contact support.";
    }
  }
  uVar6._0_8_ = uVar4 & 0xffffffff;
  uVar6.message = pcVar3;
  return uVar6;
}

Assistant:

static struct ufile_error
bucket_request_do(CURL *curl, const char* url, struct bucket_resp *br){
    struct ufile_error error = NO_ERROR;
    curl_easy_setopt(curl, CURLOPT_URL, url);
    curl_easy_setopt(curl, CURLOPT_CUSTOMREQUEST, "GET");
    if(_g_debug_open != 0){
        curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
    }
    curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);

    struct http_body response_body;
    memset(&response_body, 0, sizeof(response_body));
    char tmp[2048] = {0}; 
    response_body.buffer_size = 2048;
    response_body.buffer = tmp;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &response_body);

    error = curl_do(curl);
    cJSON *json = cJSON_Parse(response_body.buffer);
    if(json==NULL){
        error.code = UFILE_BUCKET_REQ_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        return error;
    }
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "RetCode") == 0){
            br->code = item->valueint;
        }else if(strcmp(item->string, "Message") == 0){
            br->msg = ufile_strconcat(item->valuestring, NULL);
        }
        item=item->next;
    }
    if(_g_debug_open != 0 && br->code !=0){
        printf("RetCode=%d;\nmessage=%s\n", br->code, br->msg);
    }

    cJSON_Delete(json);
    return parse_error(br);
}